

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covar.hpp
# Opt level: O0

void duckdb::CovarOperation::Operation<double,double,duckdb::CovarState,duckdb::RegrSXYOperation>
               (CovarState *state,double *y,double *x,AggregateBinaryInput *idata)

{
  double dVar1;
  uint64_t uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double C;
  double meany;
  double dy;
  double meanx;
  double dx;
  double n;
  AggregateBinaryInput *idata_local;
  double *x_local;
  double *y_local;
  CovarState *state_local;
  
  uVar2 = state->count + 1;
  state->count = uVar2;
  auVar6._8_4_ = (int)(uVar2 >> 0x20);
  auVar6._0_8_ = uVar2;
  auVar6._12_4_ = 0x45300000;
  dVar3 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  dVar4 = *x - state->meanx;
  dVar5 = state->meany + (*y - state->meany) / dVar3;
  dVar1 = *y;
  state->meanx = state->meanx + dVar4 / dVar3;
  state->meany = dVar5;
  state->co_moment = dVar4 * (dVar1 - dVar5) + state->co_moment;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &y, const B_TYPE &x, AggregateBinaryInput &idata) {
		// update running mean and d^2
		const double n = static_cast<double>(++(state.count));

		const double dx = (x - state.meanx);
		const double meanx = state.meanx + dx / n;

		const double dy = (y - state.meany);
		const double meany = state.meany + dy / n;

		//  Schubert and Gertz SSDBM 2018 (4.3)
		const double C = state.co_moment + dx * (y - meany);

		state.meanx = meanx;
		state.meany = meany;
		state.co_moment = C;
	}